

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItRandom<GeneralHash<1,unsigned_int,unsigned_char>>(uint L)

{
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  long lVar3;
  ostream *poVar4;
  uint k;
  value_type *__val;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  GeneralHash<1,_unsigned_int,_unsigned_char> hf;
  GeneralHash<1,_unsigned_int,_unsigned_char> base;
  GeneralHash<1,_unsigned_int,_unsigned_char> local_890;
  GeneralHash<1,_unsigned_int,_unsigned_char> local_460;
  long lVar11;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar2 = (undefined1 *)operator_new(5);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 1) = 0;
  auVar1 = _DAT_0010b070;
  lVar3 = 0;
  auVar10 = _DAT_0010b060;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffb) {
      puVar2[lVar3] = (char)lVar3;
      puVar2[lVar3 + 1] = (char)lVar3 + '\x01';
    }
    lVar3 = lVar3 + 2;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar11 + 2;
  } while (lVar3 != 6);
  GeneralHash<1,_unsigned_int,_unsigned_char>::GeneralHash(&local_460,5,L);
  lVar3 = 0;
  uVar6 = 0;
  do {
    uVar5 = local_460.irreduciblepoly;
    if ((local_460.lastbit & ~(uVar6 * 2)) != 0) {
      uVar5 = 0;
    }
    uVar6 = uVar5 ^ local_460.hasher.hashvalues[(byte)puVar2[lVar3]] ^ uVar6 * 2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  uVar5 = 0;
  bVar9 = true;
  do {
    GeneralHash<1,_unsigned_int,_unsigned_char>::GeneralHash(&local_890,5,L);
    lVar3 = 0;
    uVar8 = 0;
    do {
      uVar7 = local_890.irreduciblepoly;
      if ((local_890.lastbit & ~(uVar8 * 2)) != 0) {
        uVar7 = 0;
      }
      uVar8 = uVar7 ^ local_890.hasher.hashvalues[(byte)puVar2[lVar3]] ^ uVar8 * 2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    if (uVar8 == uVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      poVar4 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_890.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.precomputedshift.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (uVar8 != uVar6) goto LAB_00108759;
    bVar9 = uVar5 < 99;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  bVar9 = false;
LAB_00108759:
  if (local_460.precomputedshift.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_460.precomputedshift.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(puVar2);
  return bVar9;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}